

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O2

void re2c::emit_accept_binary
               (OutputFile *o,uint32_t ind,bool *readCh,State *s,accept_t *accepts,size_t l,size_t r
               )

{
  OutputFile *pOVar1;
  opt_t *poVar2;
  ulong n;
  char *s_00;
  
  if (l < r) {
    n = l + r >> 1;
    pOVar1 = OutputFile::wind(o,ind);
    pOVar1 = OutputFile::ws(pOVar1,"if (");
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    pOVar1 = OutputFile::wstring(pOVar1,&poVar2->yyaccept);
    s_00 = " <= ";
    if (l + 1 == r) {
      s_00 = " == ";
    }
    pOVar1 = OutputFile::ws(pOVar1,s_00);
    pOVar1 = OutputFile::wu64(pOVar1,n);
    OutputFile::ws(pOVar1,") {\n");
    emit_accept_binary(o,ind + 1,readCh,s,accepts,l,n);
    pOVar1 = OutputFile::wind(o,ind);
    OutputFile::ws(pOVar1,"} else {\n");
    emit_accept_binary(o,ind + 1,readCh,s,accepts,n + 1,r);
    pOVar1 = OutputFile::wind(o,ind);
    OutputFile::ws(pOVar1,"}\n");
    return;
  }
  genGoTo(o,ind,s,(accepts->elems).
                  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[l],readCh);
  return;
}

Assistant:

void emit_accept_binary (OutputFile & o, uint32_t ind, bool & readCh, const State * const s, const accept_t & accepts, size_t l, size_t r)
{
	if (l < r)
	{
		const size_t m = (l + r) >> 1;
		o.wind(ind).ws("if (").wstring(opts->yyaccept).ws(r == l+1 ? " == " : " <= ").wu64(m).ws(") {\n");
		emit_accept_binary (o, ++ind, readCh, s, accepts, l, m);
		o.wind(--ind).ws("} else {\n");
		emit_accept_binary (o, ++ind, readCh, s, accepts, m + 1, r);
		o.wind(--ind).ws("}\n");
	}
	else
	{
		genGoTo(o, ind, s, accepts[l], readCh);
	}
}